

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::unget(CTcTokenizer *this,CTcToken *prv)

{
  void *in_RSI;
  long in_RDI;
  CTcToken *in_stack_00000018;
  CTcTokenizer *in_stack_00000020;
  
  push(in_stack_00000020,in_stack_00000018);
  memcpy((void *)(in_RDI + 0xcc8),in_RSI,0x21);
  CTcToken::settyp((CTcToken *)(in_RDI + 0xcf0),TOKT_INVALID);
  return;
}

Assistant:

void CTcTokenizer::unget(const CTcToken *prv)
{
    /* push the current token onto the unget stack */
    push(&curtok_);

    /* go back to the previous token */
    curtok_ = *prv;

    /* the internally saved previous token is no longer valid */
    prvtok_.settyp(TOKT_INVALID);
}